

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O1

void rnn_parsefile(rnndb *db,char *file_orig)

{
  long lVar1;
  int iVar2;
  int iVar3;
  char *in_RAX;
  char *pcVar4;
  FILE *__stream;
  char **ppcVar5;
  xmlNode *node;
  rnndb *db_00;
  char *pcVar6;
  long lVar7;
  char *fname;
  char *local_38;
  
  local_38 = in_RAX;
  pcVar4 = getenv("RNN_PATH");
  pcVar6 = 
  "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O1/rnndb-generated:/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/rnndb:/usr/local/share/rnndb"
  ;
  if (pcVar4 != (char *)0x0) {
    pcVar6 = pcVar4;
  }
  __stream = (FILE *)find_in_path(file_orig,pcVar6,&local_38);
  if (__stream == (FILE *)0x0) {
    pcVar6 = "%s: couldn\'t find database file. Please set the env var RNN_PATH.\n";
    local_38 = file_orig;
  }
  else {
    fclose(__stream);
    pcVar6 = local_38;
    iVar3 = db->filesnum;
    if (0 < (long)iVar3) {
      ppcVar5 = db->files;
      lVar7 = 0;
      do {
        iVar2 = strcmp(ppcVar5[lVar7],pcVar6);
        if (iVar2 == 0) {
          free(pcVar6);
          return;
        }
        lVar7 = lVar7 + 1;
      } while (iVar3 != lVar7);
    }
    iVar2 = db->filesmax;
    if (iVar2 <= iVar3) {
      iVar3 = 0x10;
      if (iVar2 != 0) {
        iVar3 = iVar2 * 2;
      }
      db->filesmax = iVar3;
      ppcVar5 = (char **)realloc(db->files,(long)iVar3 << 3);
      db->files = ppcVar5;
    }
    iVar3 = db->filesnum;
    db->filesnum = iVar3 + 1;
    db->files[iVar3] = local_38;
    lVar7 = xmlParseFile(local_38);
    if (lVar7 != 0) {
      for (lVar1 = *(long *)(lVar7 + 0x18); lVar1 != 0; lVar1 = *(long *)(lVar1 + 0x30)) {
        if (*(int *)(lVar1 + 8) == 1) {
          pcVar6 = *(char **)(lVar1 + 0x10);
          iVar3 = strcmp(pcVar6,"database");
          if (iVar3 == 0) {
            for (db_00 = *(rnndb **)(lVar1 + 0x18); db_00 != (rnndb *)0x0;
                db_00 = (rnndb *)db_00->bitsets) {
              if (((*(int *)&(db_00->copyright).license == 1) &&
                  (pcVar6 = local_38, iVar3 = trytop(db,local_38,(xmlNode *)db_00), iVar3 == 0)) &&
                 (iVar3 = trydoc(db_00,pcVar6,node), iVar3 == 0)) {
                fprintf(_stderr,"%s:%d: wrong tag in database: <%s>\n",local_38,
                        (ulong)*(ushort *)&db_00->files,(db_00->copyright).authors);
                db->estatus = 1;
              }
            }
          }
          else {
            fprintf(_stderr,"%s:%d: wrong top-level tag <%s>\n",local_38,
                    (ulong)*(ushort *)(lVar1 + 0x70),pcVar6);
            db->estatus = 1;
          }
        }
      }
      xmlFreeDoc(lVar7);
      return;
    }
    pcVar6 = "%s: couldn\'t open database file. Please set the env var RNN_PATH.\n";
  }
  fprintf(_stderr,pcVar6,local_38);
  db->estatus = 1;
  return;
}

Assistant:

void rnn_parsefile (struct rnndb *db, char *file_orig) {
	int i;
	char *fname;
	const char *rnn_path = getenv("RNN_PATH");

	if (!rnn_path)
		rnn_path = RNN_DEF_PATH;

	FILE *file = find_in_path(file_orig, rnn_path, &fname);
	if (!file) {
		fprintf (stderr, "%s: couldn't find database file. Please set the env var RNN_PATH.\n", file_orig);
		db->estatus = 1;
		return;
	}
	fclose(file);

	for (i = 0; i < db->filesnum; i++)
		if (!strcmp(db->files[i], fname)) {
			free(fname);
			return;
		}
		
	ADDARRAY(db->files, fname);
	xmlDocPtr doc = xmlParseFile(fname);
	if (!doc) {
		fprintf (stderr, "%s: couldn't open database file. Please set the env var RNN_PATH.\n", fname);
		db->estatus = 1;
		return;
	}
	xmlNode *root = doc->children;
	while (root) {
		if (root->type != XML_ELEMENT_NODE) {
		} else if (strcmp(root->name, "database")) {
			fprintf (stderr, "%s:%d: wrong top-level tag <%s>\n", fname, root->line, root->name);
			db->estatus = 1;
		} else {
			xmlNode *chain = root->children;
			while (chain) {
				if (chain->type != XML_ELEMENT_NODE) {
				} else if (!trytop(db, fname, chain) && !trydoc(db, fname, chain)) {
					fprintf (stderr, "%s:%d: wrong tag in database: <%s>\n", fname, chain->line, chain->name);
					db->estatus = 1;
				}
				chain = chain->next;
			}
		}
		root = root->next;
	}
	xmlFreeDoc(doc);
}